

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall gl4cts::TextureViewTestGetTexParameter::deinit(TextureViewTestGetTexParameter *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  reference p_Var4;
  _test_run *test_run;
  __normal_iterator<gl4cts::TextureViewTestGetTexParameter::_test_run_*,_std::vector<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>_>
  local_20;
  _test_runs_iterator it;
  Functions *gl;
  TextureViewTestGetTexParameter *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  it._M_current = (_test_run *)CONCAT44(extraout_var,iVar2);
  local_20._M_current =
       (_test_run *)
       std::
       vector<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
       ::begin(&this->m_test_runs);
  while( true ) {
    test_run = (_test_run *)
               std::
               vector<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
               ::end(&this->m_test_runs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<gl4cts::TextureViewTestGetTexParameter::_test_run_*,_std::vector<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>_>
                        *)&test_run);
    if (!bVar1) break;
    p_Var4 = __gnu_cxx::
             __normal_iterator<gl4cts::TextureViewTestGetTexParameter::_test_run_*,_std::vector<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>_>
             ::operator*(&local_20);
    if (p_Var4->parent_texture_object_id != 0) {
      (**(code **)&it._M_current[0x1c].texture_target)(1,&p_Var4->parent_texture_object_id);
      p_Var4->parent_texture_object_id = 0;
    }
    if (p_Var4->texture_view_object_created_from_immutable_to_id != 0) {
      (**(code **)&it._M_current[0x1c].texture_target)
                (1,&p_Var4->texture_view_object_created_from_immutable_to_id);
      p_Var4->texture_view_object_created_from_immutable_to_id = 0;
    }
    if (p_Var4->texture_view_object_created_from_view_to_id != 0) {
      (**(code **)&it._M_current[0x1c].texture_target)
                (1,&p_Var4->texture_view_object_created_from_view_to_id);
      p_Var4->texture_view_object_created_from_view_to_id = 0;
    }
    __gnu_cxx::
    __normal_iterator<gl4cts::TextureViewTestGetTexParameter::_test_run_*,_std::vector<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>_>
    ::operator++(&local_20);
  }
  std::
  vector<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
  ::clear(&this->m_test_runs);
  return;
}

Assistant:

void TextureViewTestGetTexParameter::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Deinitialize all test runs */
	for (_test_runs_iterator it = m_test_runs.begin(); it != m_test_runs.end(); ++it)
	{
		_test_run& test_run = *it;

		if (test_run.parent_texture_object_id != 0)
		{
			gl.deleteTextures(1, &test_run.parent_texture_object_id);

			test_run.parent_texture_object_id = 0;
		}

		if (test_run.texture_view_object_created_from_immutable_to_id != 0)
		{
			gl.deleteTextures(1, &test_run.texture_view_object_created_from_immutable_to_id);

			test_run.texture_view_object_created_from_immutable_to_id = 0;
		}

		if (test_run.texture_view_object_created_from_view_to_id != 0)
		{
			gl.deleteTextures(1, &test_run.texture_view_object_created_from_view_to_id);

			test_run.texture_view_object_created_from_view_to_id = 0;
		}
	}
	m_test_runs.clear();
}